

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O1

void __thiscall
cbtConvexHullShape::cbtConvexHullShape
          (cbtConvexHullShape *this,cbtScalar *points,int numPoints,int stride)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtScalar cVar3;
  cbtVector3 *ptr;
  undefined8 uVar4;
  cbtVector3 *pcVar5;
  long lVar6;
  long lVar7;
  cbtScalar *pcVar8;
  
  cbtPolyhedralConvexAabbCachingShape::cbtPolyhedralConvexAabbCachingShape
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape
       = (_func_int **)&PTR__cbtConvexHullShape_00b72048;
  (this->m_unscaledPoints).m_ownsMemory = true;
  (this->m_unscaledPoints).m_data = (cbtVector3 *)0x0;
  (this->m_unscaledPoints).m_size = 0;
  (this->m_unscaledPoints).m_capacity = 0;
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 4;
  if (0 < numPoints) {
    pcVar5 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)numPoints << 4,0x10);
    lVar6 = (long)(this->m_unscaledPoints).m_size;
    if (0 < lVar6) {
      lVar7 = 0;
      do {
        puVar1 = (undefined8 *)((long)((this->m_unscaledPoints).m_data)->m_floats + lVar7);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pcVar5->m_floats + lVar7);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        lVar7 = lVar7 + 0x10;
      } while (lVar6 * 0x10 != lVar7);
    }
    ptr = (this->m_unscaledPoints).m_data;
    if (ptr != (cbtVector3 *)0x0) {
      if ((this->m_unscaledPoints).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_unscaledPoints).m_data = (cbtVector3 *)0x0;
    }
    (this->m_unscaledPoints).m_ownsMemory = true;
    (this->m_unscaledPoints).m_data = pcVar5;
    (this->m_unscaledPoints).m_capacity = numPoints;
  }
  (this->m_unscaledPoints).m_size = numPoints;
  if (0 < numPoints) {
    pcVar8 = points + 2;
    lVar6 = 0;
    do {
      cVar3 = *pcVar8;
      pcVar5 = (this->m_unscaledPoints).m_data;
      *(undefined8 *)((long)pcVar5->m_floats + lVar6) = *(undefined8 *)(pcVar8 + -2);
      *(cbtScalar *)((long)pcVar5->m_floats + lVar6 + 8) = cVar3;
      *(undefined4 *)((long)pcVar5->m_floats + lVar6 + 0xc) = 0;
      lVar6 = lVar6 + 0x10;
      pcVar8 = (cbtScalar *)((long)pcVar8 + (long)stride);
    } while ((ulong)(uint)numPoints << 4 != lVar6);
  }
  cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  return;
}

Assistant:

cbtConvexHullShape ::cbtConvexHullShape(const cbtScalar* points, int numPoints, int stride) : cbtPolyhedralConvexAabbCachingShape()
{
	m_shapeType = CONVEX_HULL_SHAPE_PROXYTYPE;
	m_unscaledPoints.resize(numPoints);

	unsigned char* pointsAddress = (unsigned char*)points;

	for (int i = 0; i < numPoints; i++)
	{
		cbtScalar* point = (cbtScalar*)pointsAddress;
		m_unscaledPoints[i] = cbtVector3(point[0], point[1], point[2]);
		pointsAddress += stride;
	}

	recalcLocalAabb();
}